

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

float DspBiQuad_Process(DspBiQuad *filter,float sample_in)

{
  float fVar1;
  float result;
  float sample_in_local;
  DspBiQuad *filter_local;
  
  fVar1 = filter->a0 * sample_in + filter->delay0;
  filter->delay0 = filter->a1 * sample_in + -(filter->b1 * fVar1) + filter->delay1;
  filter->delay1 = filter->a2 * sample_in + -(filter->b2 * fVar1);
  return fVar1 * filter->c0 + sample_in * filter->d0;
}

Assistant:

static inline float DspBiQuad_Process(DspBiQuad *filter, float sample_in)
{
	/* Direct Form II Transposed:
	 * - Less delay registers than Direct Form I
	 * - More numerically stable than Direct Form II
	 */
	float result = (filter->a0 * sample_in) + filter->delay0;
	filter->delay0 = (filter->a1 * sample_in) - (filter->b1 * result) + filter->delay1;
	filter->delay1 = (filter->a2 * sample_in) - (filter->b2 * result);

	return Undenormalize(
		(result * filter->c0) +
		(sample_in * filter->d0)
	);
}